

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::ObjCClassDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,string_view class_name)

{
  AlphaNum *in_R8;
  AlphaNum local_b8;
  AlphaNum local_88;
  string_view local_58 [3];
  
  local_58[0] = absl::lts_20250127::NullSafeStringView("GPBObjCClassDeclaration(");
  local_88.piece_._M_len = (size_t)this;
  local_88.piece_._M_str = (char *)class_name._M_len;
  local_b8.piece_ = absl::lts_20250127::NullSafeStringView(");");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_58,&local_88,&local_b8,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjCClassDeclaration(absl::string_view class_name) {
  return absl::StrCat("GPBObjCClassDeclaration(", class_name, ");");
}